

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_resampler_process_pcm_frames
                    (ma_resampler *pResampler,void *pFramesIn,ma_uint64 *pFrameCountIn,
                    void *pFramesOut,ma_uint64 *pFrameCountOut)

{
  undefined8 in_RCX;
  long in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  long in_R8;
  ma_result local_4;
  
  if (in_RDI == (undefined8 *)0x0) {
    local_4 = MA_INVALID_ARGS;
  }
  else if ((in_R8 == 0) && (in_RDX == 0)) {
    local_4 = MA_INVALID_ARGS;
  }
  else if ((in_RDI[1] == 0) || (*(long *)(in_RDI[1] + 0x18) == 0)) {
    local_4 = MA_NOT_IMPLEMENTED;
  }
  else {
    local_4 = (**(code **)(in_RDI[1] + 0x18))(in_RDI[2],*in_RDI,in_RSI,in_RDX,in_RCX,in_R8);
  }
  return local_4;
}

Assistant:

MA_API ma_result ma_resampler_process_pcm_frames(ma_resampler* pResampler, const void* pFramesIn, ma_uint64* pFrameCountIn, void* pFramesOut, ma_uint64* pFrameCountOut)
{
    if (pResampler == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pFrameCountOut == NULL && pFrameCountIn == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pResampler->pBackendVTable == NULL || pResampler->pBackendVTable->onProcess == NULL) {
        return MA_NOT_IMPLEMENTED;
    }

    return pResampler->pBackendVTable->onProcess(pResampler->pBackendUserData, pResampler->pBackend, pFramesIn, pFrameCountIn, pFramesOut, pFrameCountOut);
}